

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTzTransitionRule>::emplace<QTzTransitionRule_const&>
          (QPodArrayOps<QTzTransitionRule> *this,qsizetype i,QTzTransitionRule *args)

{
  QTzTransitionRule **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QTzTransitionRule *pQVar5;
  undefined3 uVar6;
  int iVar7;
  int iVar8;
  quint8 qVar9;
  qsizetype qVar10;
  QTzTransitionRule *pQVar11;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QTzTransitionRule>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QTzTransitionRule>).size == i) &&
       (qVar10 = QArrayDataPointer<QTzTransitionRule>::freeSpaceAtEnd
                           (&this->super_QArrayDataPointer<QTzTransitionRule>), qVar10 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<QTzTransitionRule>).size;
      pQVar11 = (this->super_QArrayDataPointer<QTzTransitionRule>).ptr;
      uVar6 = *(undefined3 *)&args->field_0x9;
      pQVar5 = pQVar11 + lVar4;
      pQVar5->abbreviationIndex = args->abbreviationIndex;
      *(undefined3 *)&pQVar5->field_0x9 = uVar6;
      iVar7 = args->dstOffset;
      pQVar11 = pQVar11 + lVar4;
      pQVar11->stdOffset = args->stdOffset;
      pQVar11->dstOffset = iVar7;
    }
    else {
      if ((i != 0) ||
         (qVar10 = QArrayDataPointer<QTzTransitionRule>::freeSpaceAtBegin
                             (&this->super_QArrayDataPointer<QTzTransitionRule>), qVar10 == 0))
      goto LAB_003b815f;
      pQVar11 = (this->super_QArrayDataPointer<QTzTransitionRule>).ptr;
      uVar6 = *(undefined3 *)&args->field_0x9;
      pQVar11[-1].abbreviationIndex = args->abbreviationIndex;
      *(undefined3 *)&pQVar11[-1].field_0x9 = uVar6;
      iVar7 = args->dstOffset;
      pQVar11[-1].stdOffset = args->stdOffset;
      pQVar11[-1].dstOffset = iVar7;
      ppQVar1 = &(this->super_QArrayDataPointer<QTzTransitionRule>).ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QTzTransitionRule>).size;
    *pqVar2 = *pqVar2 + 1;
    return;
  }
LAB_003b815f:
  qVar9 = args->abbreviationIndex;
  uVar6 = *(undefined3 *)&args->field_0x9;
  iVar7 = args->stdOffset;
  iVar8 = args->dstOffset;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QTzTransitionRule>).size != 0);
  QArrayDataPointer<QTzTransitionRule>::detachAndGrow
            (&this->super_QArrayDataPointer<QTzTransitionRule>,where,1,(QTzTransitionRule **)0x0,
             (QArrayDataPointer<QTzTransitionRule> *)0x0);
  pQVar11 = createHole(this,where,i,1);
  pQVar11->stdOffset = iVar7;
  pQVar11->dstOffset = iVar8;
  pQVar11->abbreviationIndex = qVar9;
  *(undefined3 *)&pQVar11->field_0x9 = uVar6;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }